

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::resize(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
         *this,size_t new_capacity)

{
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  size_t sVar2;
  FindInfo FVar3;
  Layout LVar4;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar1 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar2 = 0;
      do {
        if (-1 < p[sVar2]) {
          FVar3 = find_first_non_full((raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
                                       *)this->ctrl_,this->capacity_);
          set_ctrl(this,FVar3.offset,'\0');
          this->slots_[FVar3.offset] = psVar1[sVar2];
        }
        sVar2 = sVar2 + 1;
      } while (capacity != sVar2);
      LVar4 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<int>>
                ((allocator<int> *)&this->settings_,p,
                 (LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0] + 7 &
                 0xfffffffffffffff8) +
                 LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] * 8);
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::priv::(anonymous namespace)::BadFastHash, std::equal_to<int>, std::allocator<int>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::priv::(anonymous namespace)::BadFastHash, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }